

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::
emplace<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
          (QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *this,
          unsigned_long_long *key,shared_ptr<const_QGradientCache::CacheInfo> *args)

{
  long lVar1;
  bool bVar2;
  shared_ptr<const_QGradientCache::CacheInfo> *in_RDX;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> copy;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>
  *in_stack_ffffffffffffff98;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>
  *in_stack_ffffffffffffffa0;
  iterator *key_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00 = in_RDI;
  bVar2 = QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::
          isDetached(in_stack_ffffffffffffffa0);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
            ::shouldGrow(in_RSI->d);
    if (bVar2) {
      std::shared_ptr<const_QGradientCache::CacheInfo>::shared_ptr
                (in_RDX,(shared_ptr<const_QGradientCache::CacheInfo> *)in_stack_ffffffffffffff98);
      emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>>
                (in_RSI,(unsigned_long_long *)key_00,
                 (shared_ptr<const_QGradientCache::CacheInfo> *)in_RDI);
      std::shared_ptr<const_QGradientCache::CacheInfo>::~shared_ptr
                ((shared_ptr<const_QGradientCache::CacheInfo> *)0x5823e3);
    }
    else {
      emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
                (in_RSI,(unsigned_long_long *)key_00,
                 (shared_ptr<const_QGradientCache::CacheInfo> *)in_RDI);
    }
  }
  else {
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::QMultiHash
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::detach
              (in_stack_ffffffffffffffa0);
    emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
              (in_RSI,(unsigned_long_long *)key_00,
               (shared_ptr<const_QGradientCache::CacheInfo> *)in_RDI);
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::~QMultiHash
              (in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return key_00;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }